

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

format_decimal_result<char_*>
fmt::v7::detail::format_decimal<char,unsigned_long>(char *out,unsigned_long value,int size)

{
  char *pcVar1;
  char *pcVar2;
  format_decimal_result<char_*> fVar3;
  
  pcVar1 = out + size;
  for (; pcVar2 = pcVar1 + -2, 99 < value; value = value / 100) {
    *(undefined2 *)pcVar2 = *(undefined2 *)(basic_data<void>::digits + (value % 100) * 2);
    pcVar1 = pcVar2;
  }
  if (value < 10) {
    pcVar1[-1] = (byte)value | 0x30;
    pcVar2 = pcVar1 + -1;
  }
  else {
    *(undefined2 *)pcVar2 = *(undefined2 *)(basic_data<void>::digits + value * 2);
  }
  fVar3.end = out + size;
  fVar3.begin = pcVar2;
  return fVar3;
}

Assistant:

inline format_decimal_result<Char*> format_decimal(Char* out, UInt value,
                                                   int size) {
  FMT_ASSERT(size >= count_digits(value), "invalid digit count");
  out += size;
  Char* end = out;
  while (value >= 100) {
    // Integer division is slow so do it for a group of two digits instead
    // of for every digit. The idea comes from the talk by Alexandrescu
    // "Three Optimization Tips for C++". See speed-test for a comparison.
    out -= 2;
    copy2(out, data::digits[value % 100]);
    value /= 100;
  }
  if (value < 10) {
    *--out = static_cast<Char>('0' + value);
    return {out, end};
  }
  out -= 2;
  copy2(out, data::digits[value]);
  return {out, end};
}